

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O1

int __thiscall GoState<5U,_4U>::get_player_score(GoState<5U,_4U> *this,int player)

{
  uint uVar1;
  int iVar2;
  int j;
  ulong uVar3;
  uchar (*pauVar4) [4];
  int i;
  ulong uVar5;
  
  pauVar4 = this->board;
  uVar5 = 0;
  iVar2 = 0;
  do {
    uVar3 = 0;
    do {
      if ((*pauVar4)[uVar3] == '\0') {
        uVar1 = (*this->_vptr_GoState[7])(this,uVar5 & 0xffffffff,uVar3 & 0xffffffff,player);
        iVar2 = iVar2 + (uVar1 & 0xff);
      }
      iVar2 = (uint)((uint)(*pauVar4)[uVar3] == player) + iVar2;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 4);
    uVar5 = uVar5 + 1;
    pauVar4 = pauVar4 + 1;
  } while (uVar5 != 5);
  return iVar2;
}

Assistant:

virtual int get_player_score(int player) const
	{
		int score = 0;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (board[i][j] == empty) {
				if (is_eye(i, j, player)) {
					score++;
				}
			}
			if (board[i][j] == player) {
				score++;
			}
		}}
		return score;
	}